

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_robertson_constraints.c
# Opt level: O2

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  double dVar1;
  double dVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  double *pdVar6;
  double *pdVar7;
  
  lVar3 = *(long *)((long)y->content + 0x10);
  dVar1 = *(double *)(lVar3 + 8);
  dVar2 = *(double *)(lVar3 + 0x10);
  SUNMatZero(J);
  puVar4 = *(undefined8 **)((long)J->content + 0x20);
  puVar5 = (undefined8 *)*puVar4;
  *puVar5 = 0xbfa47ae147ae147b;
  pdVar6 = (double *)puVar4[1];
  *pdVar6 = dVar2 * 10000.0;
  pdVar7 = (double *)puVar4[2];
  *pdVar7 = dVar1 * 10000.0;
  puVar5[1] = 0x3fa47ae147ae147b;
  pdVar6[1] = dVar2 * -10000.0 - dVar1 * 60000000.0;
  pdVar7[1] = dVar1 * -10000.0;
  pdVar6[2] = dVar1 * 60000000.0;
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype v = NV_Ith_S(y, 1); /* access current solution */
  sunrealtype w = NV_Ith_S(y, 2);
  SUNMatZero(J); /* initialize Jacobian to zero */

  /* Fill in the Jacobian of the ODE RHS function */
  SM_ELEMENT_D(J, 0, 0) = -0.04;
  SM_ELEMENT_D(J, 0, 1) = 1.e4 * w;
  SM_ELEMENT_D(J, 0, 2) = 1.e4 * v;

  SM_ELEMENT_D(J, 1, 0) = 0.04;
  SM_ELEMENT_D(J, 1, 1) = -1.e4 * w - 6.e7 * v;
  SM_ELEMENT_D(J, 1, 2) = -1.e4 * v;

  SM_ELEMENT_D(J, 2, 1) = 6.e7 * v;

  return 0; /* Return with success */
}